

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void PreVisitWith(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  Scope *pSVar2;
  FuncInfo *func;
  ParseNodeWith *pPVar3;
  TrackAllocData local_50;
  Scope *local_28;
  Scope *scope;
  ArenaAllocator *alloc;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  alloc = (ArenaAllocator *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
  pAVar1 = &ByteCodeGenerator::GetAllocator(byteCodeGenerator)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  scope = (Scope *)pAVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&Scope::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
             ,0xea0);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_50);
  pSVar2 = (Scope *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar1,0x3f67b0);
  Scope::Scope(pSVar2,(ArenaAllocator *)scope,ScopeType_With,0);
  local_28 = pSVar2;
  func = ByteCodeGenerator::TopFuncInfo((ByteCodeGenerator *)alloc);
  Scope::SetFunc(pSVar2,func);
  Scope::SetIsDynamic(local_28,true);
  pSVar2 = local_28;
  pPVar3 = ParseNode::AsParseNodeWith((ParseNode *)byteCodeGenerator_local);
  pPVar3->scope = pSVar2;
  ByteCodeGenerator::PushScope((ByteCodeGenerator *)alloc,local_28);
  return;
}

Assistant:

void PreVisitWith(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    Scope *scope = Anew(alloc, Scope, alloc, ScopeType_With);
    scope->SetFunc(byteCodeGenerator->TopFuncInfo());
    scope->SetIsDynamic(true);
    pnode->AsParseNodeWith()->scope = scope;

    byteCodeGenerator->PushScope(scope);
}